

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_kneip::groebnerRow43_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  long lVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  
  lVar43 = (long)targetRow;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x17fa];
  auVar42._8_8_ = 0x8000000000000000;
  auVar42._0_8_ = 0x8000000000000000;
  auVar44 = vxorpd_avx512vl(auVar45,auVar42);
  auVar46._0_8_ =
       auVar44._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1825];
  auVar46._8_8_ = auVar44._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x17fa] = 0.0;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x18a9];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x187e];
  auVar44 = vfmadd213sd_fma(auVar47,auVar46,auVar44);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x187e] = auVar44._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x18eb];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x18c0];
  auVar44 = vfmadd213sd_fma(auVar48,auVar46,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x18c0] = auVar44._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2065];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x203a];
  auVar44 = vfmadd213sd_fma(auVar49,auVar46,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x203a] = auVar44._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20a7];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x207c];
  auVar44 = vfmadd213sd_fma(auVar50,auVar46,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x207c] = auVar44._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x212b];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x2100];
  auVar44 = vfmadd213sd_fma(auVar51,auVar46,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2100] = auVar44._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x216d];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x2142];
  auVar44 = vfmadd213sd_fma(auVar52,auVar46,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2142] = auVar44._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x21f1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x21c6];
  auVar44 = vfmadd213sd_fma(auVar53,auVar46,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x21c6] = auVar44._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2233];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x2208];
  auVar44 = vfmadd213sd_fma(auVar54,auVar46,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2208] = auVar44._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2275];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x224a];
  auVar44 = vfmadd213sd_fma(auVar55,auVar46,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x224a] = auVar44._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x22b7];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar43 + 0x228c];
  auVar44 = vfmadd213sd_fma(auVar56,auVar46,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x228c] = auVar44._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x22f9];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x22ce];
  auVar44 = vfmadd213sd_fma(auVar57,auVar46,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x22ce] = auVar44._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x233b];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2310];
  auVar44 = vfmadd213sd_fma(auVar58,auVar46,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2310] = auVar44._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x237d];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2352];
  auVar44 = vfmadd213sd_fma(auVar59,auVar46,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2352] = auVar44._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x23bf];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2394];
  auVar44 = vfmadd213sd_fma(auVar60,auVar46,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2394] = auVar44._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2401];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x23d6];
  auVar44 = vfmadd213sd_fma(auVar61,auVar46,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x23d6] = auVar44._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2443];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2418];
  auVar44 = vfmadd213sd_fma(auVar62,auVar46,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2418] = auVar44._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2485];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x245a];
  auVar44 = vfmadd213sd_fma(auVar63,auVar46,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x245a] = auVar44._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2bff];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2bd4];
  auVar44 = vfmadd213sd_fma(auVar64,auVar46,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2bd4] = auVar44._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c41];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2c16];
  auVar44 = vfmadd213sd_fma(auVar65,auVar46,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2c16] = auVar44._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2cc5];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2c9a];
  auVar44 = vfmadd213sd_fma(auVar66,auVar46,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2c9a] = auVar44._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d07];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2cdc];
  auVar44 = vfmadd213sd_fma(auVar67,auVar46,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2cdc] = auVar44._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d8b];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2d60];
  auVar44 = vfmadd213sd_fma(auVar68,auVar46,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2d60] = auVar44._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dcd];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2da2];
  auVar44 = vfmadd213sd_fma(auVar69,auVar46,auVar22);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2da2] = auVar44._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e0f];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2de4];
  auVar44 = vfmadd213sd_fma(auVar70,auVar46,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2de4] = auVar44._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e51];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2e26];
  auVar44 = vfmadd213sd_fma(auVar71,auVar46,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2e26] = auVar44._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e93];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2e68];
  auVar44 = vfmadd213sd_fma(auVar72,auVar46,auVar25);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2e68] = auVar44._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ed5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2eaa];
  auVar44 = vfmadd213sd_fma(auVar73,auVar46,auVar26);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2eaa] = auVar44._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f17];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2eec];
  auVar44 = vfmadd213sd_fma(auVar74,auVar46,auVar27);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2eec] = auVar44._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f59];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2f2e];
  auVar44 = vfmadd213sd_fma(auVar75,auVar46,auVar28);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2f2e] = auVar44._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f9b];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2f70];
  auVar44 = vfmadd213sd_fma(auVar76,auVar46,auVar29);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2f70] = auVar44._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fdd];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2fb2];
  auVar44 = vfmadd213sd_fma(auVar77,auVar46,auVar30);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2fb2] = auVar44._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x301f];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x2ff4];
  auVar44 = vfmadd213sd_fma(auVar78,auVar46,auVar31);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x2ff4] = auVar44._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3061];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3036];
  auVar44 = vfmadd213sd_fma(auVar79,auVar46,auVar32);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3036] = auVar44._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30a3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3078];
  auVar44 = vfmadd213sd_fma(auVar80,auVar46,auVar33);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3078] = auVar44._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30e5];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x30ba];
  auVar44 = vfmadd213sd_fma(auVar81,auVar46,auVar34);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x30ba] = auVar44._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3127];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x30fc];
  auVar44 = vfmadd213sd_fma(auVar82,auVar46,auVar35);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x30fc] = auVar44._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3169];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x313e];
  auVar44 = vfmadd213sd_fma(auVar83,auVar46,auVar36);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x313e] = auVar44._0_8_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31ab];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3180];
  auVar44 = vfmadd213sd_fma(auVar84,auVar46,auVar37);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3180] = auVar44._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31ed];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x31c2];
  auVar44 = vfmadd213sd_fma(auVar85,auVar46,auVar38);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x31c2] = auVar44._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x322f];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3204];
  auVar44 = vfmadd213sd_fma(auVar86,auVar46,auVar39);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3204] = auVar44._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3271];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3246];
  auVar44 = vfmadd213sd_fma(auVar87,auVar46,auVar40);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3246] = auVar44._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x32b3];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar43 + 0x3288];
  auVar44 = vfmadd213sd_fma(auVar88,auVar46,auVar41);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar43 + 0x3288] = auVar44._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow43_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,93) / groebnerMatrix(43,93);
  groebnerMatrix(targetRow,93) = 0.0;
  groebnerMatrix(targetRow,95) -= factor * groebnerMatrix(43,95);
  groebnerMatrix(targetRow,96) -= factor * groebnerMatrix(43,96);
  groebnerMatrix(targetRow,125) -= factor * groebnerMatrix(43,125);
  groebnerMatrix(targetRow,126) -= factor * groebnerMatrix(43,126);
  groebnerMatrix(targetRow,128) -= factor * groebnerMatrix(43,128);
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(43,129);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(43,131);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(43,132);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(43,133);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(43,134);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(43,135);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(43,136);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(43,137);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(43,138);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(43,139);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(43,140);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(43,141);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(43,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(43,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(43,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(43,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(43,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(43,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(43,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(43,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(43,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(43,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(43,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(43,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(43,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(43,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(43,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(43,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(43,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(43,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(43,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(43,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(43,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(43,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(43,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(43,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(43,196);
}